

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# propagate_operator.cpp
# Opt level: O1

unique_ptr<duckdb::BaseStatistics,_std::default_delete<duckdb::BaseStatistics>,_true> __thiscall
duckdb::StatisticsPropagator::PropagateExpression
          (StatisticsPropagator *this,BoundOperatorExpression *expr,
          unique_ptr<duckdb::Expression,_std::default_delete<duckdb::Expression>,_true> *expr_ptr)

{
  vector<duckdb::unique_ptr<duckdb::Expression,_std::default_delete<duckdb::Expression>,_true>,_std::allocator<duckdb::unique_ptr<duckdb::Expression,_std::default_delete<duckdb::Expression>,_true>_>_>
  *this_00;
  char cVar1;
  _Head_base<0UL,_duckdb::Expression_*,_false> _Var2;
  long *plVar3;
  pointer puVar4;
  unique_ptr<duckdb::Expression,_std::default_delete<duckdb::Expression>,_true> *puVar5;
  Optimizer *pOVar6;
  bool bVar7;
  reference pvVar8;
  pointer pBVar9;
  BoundConstantExpression *this_01;
  long lVar10;
  reference pvVar11;
  type other;
  _Head_base<0UL,_duckdb::BaseStatistics_*,_false> _Var12;
  long *in_RCX;
  _Head_base<0UL,_duckdb::BaseStatistics_*,_false> _Var13;
  _Head_base<0UL,_duckdb::Expression_*,_false> _Var14;
  ulong val;
  size_type sVar15;
  vector<duckdb::unique_ptr<duckdb::BaseStatistics,_std::default_delete<duckdb::BaseStatistics>,_true>,_true>
  child_stats;
  unique_ptr<duckdb::BaseStatistics,_std::default_delete<duckdb::BaseStatistics>,_true> stats;
  vector<duckdb::unique_ptr<duckdb::BaseStatistics,_std::default_delete<duckdb::BaseStatistics>,_true>,_std::allocator<duckdb::unique_ptr<duckdb::BaseStatistics,_std::default_delete<duckdb::BaseStatistics>,_true>_>_>
  local_e8;
  unique_ptr<duckdb::Expression,_std::default_delete<duckdb::Expression>,_true> *local_c8;
  BoundOperatorExpression *local_c0;
  _Head_base<0UL,_duckdb::BaseStatistics_*,_false> local_b8;
  Value local_b0;
  Optimizer *local_70 [8];
  
  local_e8.
  super__Vector_base<duckdb::unique_ptr<duckdb::BaseStatistics,_std::default_delete<duckdb::BaseStatistics>,_true>,_std::allocator<duckdb::unique_ptr<duckdb::BaseStatistics,_std::default_delete<duckdb::BaseStatistics>,_true>_>_>
  ._M_impl.super__Vector_impl_data._M_start = (pointer)0x0;
  local_e8.
  super__Vector_base<duckdb::unique_ptr<duckdb::BaseStatistics,_std::default_delete<duckdb::BaseStatistics>,_true>,_std::allocator<duckdb::unique_ptr<duckdb::BaseStatistics,_std::default_delete<duckdb::BaseStatistics>,_true>_>_>
  ._M_impl.super__Vector_impl_data._M_finish =
       (unique_ptr<duckdb::BaseStatistics,_std::default_delete<duckdb::BaseStatistics>,_true> *)0x0;
  local_e8.
  super__Vector_base<duckdb::unique_ptr<duckdb::BaseStatistics,_std::default_delete<duckdb::BaseStatistics>,_true>,_std::allocator<duckdb::unique_ptr<duckdb::BaseStatistics,_std::default_delete<duckdb::BaseStatistics>,_true>_>_>
  ._M_impl.super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
  local_c0 = expr;
  ::std::
  vector<duckdb::unique_ptr<duckdb::BaseStatistics,_std::default_delete<duckdb::BaseStatistics>,_true>,_std::allocator<duckdb::unique_ptr<duckdb::BaseStatistics,_std::default_delete<duckdb::BaseStatistics>,_true>_>_>
  ::reserve(&local_e8,
            (long)expr_ptr[0xc].
                  super_unique_ptr<duckdb::Expression,_std::default_delete<duckdb::Expression>_>.
                  _M_t.
                  super___uniq_ptr_impl<duckdb::Expression,_std::default_delete<duckdb::Expression>_>
                  ._M_t.
                  super__Tuple_impl<0UL,_duckdb::Expression_*,_std::default_delete<duckdb::Expression>_>
                  .super__Head_base<0UL,_duckdb::Expression_*,_false>._M_head_impl -
            (long)expr_ptr[0xb].
                  super_unique_ptr<duckdb::Expression,_std::default_delete<duckdb::Expression>_>.
                  _M_t.
                  super___uniq_ptr_impl<duckdb::Expression,_std::default_delete<duckdb::Expression>_>
                  ._M_t.
                  super__Tuple_impl<0UL,_duckdb::Expression_*,_std::default_delete<duckdb::Expression>_>
                  .super__Head_base<0UL,_duckdb::Expression_*,_false>._M_head_impl >> 3);
  _Var14._M_head_impl =
       expr_ptr[0xb].super_unique_ptr<duckdb::Expression,_std::default_delete<duckdb::Expression>_>.
       _M_t.super___uniq_ptr_impl<duckdb::Expression,_std::default_delete<duckdb::Expression>_>._M_t
       .super__Tuple_impl<0UL,_duckdb::Expression_*,_std::default_delete<duckdb::Expression>_>.
       super__Head_base<0UL,_duckdb::Expression_*,_false>._M_head_impl;
  _Var2._M_head_impl =
       expr_ptr[0xc].super_unique_ptr<duckdb::Expression,_std::default_delete<duckdb::Expression>_>.
       _M_t.super___uniq_ptr_impl<duckdb::Expression,_std::default_delete<duckdb::Expression>_>._M_t
       .super__Tuple_impl<0UL,_duckdb::Expression_*,_std::default_delete<duckdb::Expression>_>.
       super__Head_base<0UL,_duckdb::Expression_*,_false>._M_head_impl;
  local_c8 = expr_ptr;
  if (_Var14._M_head_impl == _Var2._M_head_impl) {
LAB_00d4959f:
    puVar5 = local_c8;
    cVar1 = *(char *)&local_c8[1].
                      super_unique_ptr<duckdb::Expression,_std::default_delete<duckdb::Expression>_>
                      ._M_t.
                      super___uniq_ptr_impl<duckdb::Expression,_std::default_delete<duckdb::Expression>_>
                      ._M_t.
                      super__Tuple_impl<0UL,_duckdb::Expression_*,_std::default_delete<duckdb::Expression>_>
                      .super__Head_base<0UL,_duckdb::Expression_*,_false>._M_head_impl;
    _Var12._M_head_impl = (BaseStatistics *)this;
    if (cVar1 == '\x0e') {
      pvVar8 = vector<duckdb::unique_ptr<duckdb::BaseStatistics,_std::default_delete<duckdb::BaseStatistics>,_true>,_true>
               ::operator[]((vector<duckdb::unique_ptr<duckdb::BaseStatistics,_std::default_delete<duckdb::BaseStatistics>,_true>,_true>
                             *)&local_e8,0);
      pBVar9 = unique_ptr<duckdb::BaseStatistics,_std::default_delete<duckdb::BaseStatistics>,_true>
               ::operator->(pvVar8);
      bVar7 = BaseStatistics::CanHaveNull(pBVar9);
      if (bVar7) {
        pvVar8 = vector<duckdb::unique_ptr<duckdb::BaseStatistics,_std::default_delete<duckdb::BaseStatistics>,_true>,_true>
                 ::operator[]((vector<duckdb::unique_ptr<duckdb::BaseStatistics,_std::default_delete<duckdb::BaseStatistics>,_true>,_true>
                               *)&local_e8,0);
        pBVar9 = unique_ptr<duckdb::BaseStatistics,_std::default_delete<duckdb::BaseStatistics>,_true>
                 ::operator->(pvVar8);
        bVar7 = BaseStatistics::CanHaveNoNull(pBVar9);
        if (bVar7) goto LAB_00d49728;
        Value::BOOLEAN(&local_b0,true);
        this_01 = (BoundConstantExpression *)operator_new(0x98);
        Value::Value((Value *)local_70,&local_b0);
        BoundConstantExpression::BoundConstantExpression(this_01,(Value *)local_70);
      }
      else {
        Value::BOOLEAN(&local_b0,false);
        this_01 = (BoundConstantExpression *)operator_new(0x98);
        Value::Value((Value *)local_70,&local_b0);
        BoundConstantExpression::BoundConstantExpression(this_01,(Value *)local_70);
      }
    }
    else {
      if (cVar1 != '\x0f') {
        if (cVar1 != -0x68) goto LAB_00d49728;
        this_00 = (vector<duckdb::unique_ptr<duckdb::Expression,_std::default_delete<duckdb::Expression>,_true>,_std::allocator<duckdb::unique_ptr<duckdb::Expression,_std::default_delete<duckdb::Expression>,_true>_>_>
                   *)(local_c8 + 0xb);
        if (local_c8[0xc].
            super_unique_ptr<duckdb::Expression,_std::default_delete<duckdb::Expression>_>._M_t.
            super___uniq_ptr_impl<duckdb::Expression,_std::default_delete<duckdb::Expression>_>._M_t
            .super__Tuple_impl<0UL,_duckdb::Expression_*,_std::default_delete<duckdb::Expression>_>.
            super__Head_base<0UL,_duckdb::Expression_*,_false>._M_head_impl !=
            local_c8[0xb].
            super_unique_ptr<duckdb::Expression,_std::default_delete<duckdb::Expression>_>._M_t.
            super___uniq_ptr_impl<duckdb::Expression,_std::default_delete<duckdb::Expression>_>._M_t
            .super__Tuple_impl<0UL,_duckdb::Expression_*,_std::default_delete<duckdb::Expression>_>.
            super__Head_base<0UL,_duckdb::Expression_*,_false>._M_head_impl) {
          sVar15 = 0;
          do {
            pvVar8 = vector<duckdb::unique_ptr<duckdb::BaseStatistics,_std::default_delete<duckdb::BaseStatistics>,_true>,_true>
                     ::operator[]((vector<duckdb::unique_ptr<duckdb::BaseStatistics,_std::default_delete<duckdb::BaseStatistics>,_true>,_true>
                                   *)&local_e8,sVar15);
            pBVar9 = unique_ptr<duckdb::BaseStatistics,_std::default_delete<duckdb::BaseStatistics>,_true>
                     ::operator->(pvVar8);
            bVar7 = BaseStatistics::CanHaveNoNull(pBVar9);
            if (bVar7) {
              pvVar8 = vector<duckdb::unique_ptr<duckdb::BaseStatistics,_std::default_delete<duckdb::BaseStatistics>,_true>,_true>
                       ::operator[]((vector<duckdb::unique_ptr<duckdb::BaseStatistics,_std::default_delete<duckdb::BaseStatistics>,_true>,_true>
                                     *)&local_e8,sVar15);
              pBVar9 = unique_ptr<duckdb::BaseStatistics,_std::default_delete<duckdb::BaseStatistics>,_true>
                       ::operator->(pvVar8);
              bVar7 = BaseStatistics::CanHaveNull(pBVar9);
              if (!bVar7) {
                val = sVar15 + 1;
                _Var14._M_head_impl =
                     puVar5[0xb].
                     super_unique_ptr<duckdb::Expression,_std::default_delete<duckdb::Expression>_>.
                     _M_t.
                     super___uniq_ptr_impl<duckdb::Expression,_std::default_delete<duckdb::Expression>_>
                     ._M_t.
                     super__Tuple_impl<0UL,_duckdb::Expression_*,_std::default_delete<duckdb::Expression>_>
                     .super__Head_base<0UL,_duckdb::Expression_*,_false>._M_head_impl;
                if (val < (ulong)((long)puVar5[0xc].
                                        super_unique_ptr<duckdb::Expression,_std::default_delete<duckdb::Expression>_>
                                        ._M_t.
                                        super___uniq_ptr_impl<duckdb::Expression,_std::default_delete<duckdb::Expression>_>
                                        ._M_t.
                                        super__Tuple_impl<0UL,_duckdb::Expression_*,_std::default_delete<duckdb::Expression>_>
                                        .super__Head_base<0UL,_duckdb::Expression_*,_false>.
                                        _M_head_impl - (long)_Var14._M_head_impl >> 3)) {
                  lVar10 = NumericCastImpl<long,_unsigned_long,_false>::Convert(val);
                  ::std::
                  vector<duckdb::unique_ptr<duckdb::Expression,_std::default_delete<duckdb::Expression>,_true>,_std::allocator<duckdb::unique_ptr<duckdb::Expression,_std::default_delete<duckdb::Expression>,_true>_>_>
                  ::_M_erase(this_00,(unique_ptr<duckdb::Expression,_std::default_delete<duckdb::Expression>,_true>
                                      *)((long)&(_Var14._M_head_impl)->super_BaseExpression +
                                        lVar10 * 8),
                             (unique_ptr<duckdb::Expression,_std::default_delete<duckdb::Expression>,_true>
                              *)puVar5[0xc].
                                super_unique_ptr<duckdb::Expression,_std::default_delete<duckdb::Expression>_>
                                ._M_t.
                                super___uniq_ptr_impl<duckdb::Expression,_std::default_delete<duckdb::Expression>_>
                                ._M_t.
                                super__Tuple_impl<0UL,_duckdb::Expression_*,_std::default_delete<duckdb::Expression>_>
                                .super__Head_base<0UL,_duckdb::Expression_*,_false>._M_head_impl);
                  puVar4 = local_e8.
                           super__Vector_base<duckdb::unique_ptr<duckdb::BaseStatistics,_std::default_delete<duckdb::BaseStatistics>,_true>,_std::allocator<duckdb::unique_ptr<duckdb::BaseStatistics,_std::default_delete<duckdb::BaseStatistics>,_true>_>_>
                           ._M_impl.super__Vector_impl_data._M_start;
                  lVar10 = NumericCastImpl<long,_unsigned_long,_false>::Convert(val);
                  ::std::
                  vector<duckdb::unique_ptr<duckdb::BaseStatistics,_std::default_delete<duckdb::BaseStatistics>,_true>,_std::allocator<duckdb::unique_ptr<duckdb::BaseStatistics,_std::default_delete<duckdb::BaseStatistics>,_true>_>_>
                  ::_M_erase(&local_e8,puVar4 + lVar10,
                             (iterator)
                             local_e8.
                             super__Vector_base<duckdb::unique_ptr<duckdb::BaseStatistics,_std::default_delete<duckdb::BaseStatistics>,_true>,_std::allocator<duckdb::unique_ptr<duckdb::BaseStatistics,_std::default_delete<duckdb::BaseStatistics>,_true>_>_>
                             ._M_impl.super__Vector_impl_data._M_finish);
                }
                break;
              }
            }
            else if (8 < (ulong)((long)puVar5[0xc].
                                       super_unique_ptr<duckdb::Expression,_std::default_delete<duckdb::Expression>_>
                                       ._M_t.
                                       super___uniq_ptr_impl<duckdb::Expression,_std::default_delete<duckdb::Expression>_>
                                       ._M_t.
                                       super__Tuple_impl<0UL,_duckdb::Expression_*,_std::default_delete<duckdb::Expression>_>
                                       .super__Head_base<0UL,_duckdb::Expression_*,_false>.
                                       _M_head_impl -
                                (long)puVar5[0xb].
                                      super_unique_ptr<duckdb::Expression,_std::default_delete<duckdb::Expression>_>
                                      ._M_t.
                                      super___uniq_ptr_impl<duckdb::Expression,_std::default_delete<duckdb::Expression>_>
                                      ._M_t.
                                      super__Tuple_impl<0UL,_duckdb::Expression_*,_std::default_delete<duckdb::Expression>_>
                                      .super__Head_base<0UL,_duckdb::Expression_*,_false>.
                                      _M_head_impl)) {
              vector<duckdb::unique_ptr<duckdb::Expression,_std::default_delete<duckdb::Expression>,_true>,_true>
              ::erase_at((vector<duckdb::unique_ptr<duckdb::Expression,_std::default_delete<duckdb::Expression>,_true>,_true>
                          *)this_00,sVar15);
              vector<duckdb::unique_ptr<duckdb::BaseStatistics,_std::default_delete<duckdb::BaseStatistics>,_true>,_true>
              ::erase_at((vector<duckdb::unique_ptr<duckdb::BaseStatistics,_std::default_delete<duckdb::BaseStatistics>,_true>,_true>
                          *)&local_e8,sVar15);
              sVar15 = sVar15 - 1;
            }
            sVar15 = sVar15 + 1;
          } while (sVar15 < (ulong)((long)puVar5[0xc].
                                          super_unique_ptr<duckdb::Expression,_std::default_delete<duckdb::Expression>_>
                                          ._M_t.
                                          super___uniq_ptr_impl<duckdb::Expression,_std::default_delete<duckdb::Expression>_>
                                          ._M_t.
                                          super__Tuple_impl<0UL,_duckdb::Expression_*,_std::default_delete<duckdb::Expression>_>
                                          .super__Head_base<0UL,_duckdb::Expression_*,_false>.
                                          _M_head_impl -
                                    (long)puVar5[0xb].
                                          super_unique_ptr<duckdb::Expression,_std::default_delete<duckdb::Expression>_>
                                          ._M_t.
                                          super___uniq_ptr_impl<duckdb::Expression,_std::default_delete<duckdb::Expression>_>
                                          ._M_t.
                                          super__Tuple_impl<0UL,_duckdb::Expression_*,_std::default_delete<duckdb::Expression>_>
                                          .super__Head_base<0UL,_duckdb::Expression_*,_false>.
                                          _M_head_impl >> 3));
        }
        if ((long)puVar5[0xc].
                  super_unique_ptr<duckdb::Expression,_std::default_delete<duckdb::Expression>_>.
                  _M_t.
                  super___uniq_ptr_impl<duckdb::Expression,_std::default_delete<duckdb::Expression>_>
                  ._M_t.
                  super__Tuple_impl<0UL,_duckdb::Expression_*,_std::default_delete<duckdb::Expression>_>
                  .super__Head_base<0UL,_duckdb::Expression_*,_false>._M_head_impl -
            (long)puVar5[0xb].
                  super_unique_ptr<duckdb::Expression,_std::default_delete<duckdb::Expression>_>.
                  _M_t.
                  super___uniq_ptr_impl<duckdb::Expression,_std::default_delete<duckdb::Expression>_>
                  ._M_t.
                  super__Tuple_impl<0UL,_duckdb::Expression_*,_std::default_delete<duckdb::Expression>_>
                  .super__Head_base<0UL,_duckdb::Expression_*,_false>._M_head_impl == 8) {
          pvVar11 = vector<duckdb::unique_ptr<duckdb::Expression,_std::default_delete<duckdb::Expression>,_true>,_true>
                    ::operator[]((vector<duckdb::unique_ptr<duckdb::Expression,_std::default_delete<duckdb::Expression>,_true>,_true>
                                  *)this_00,0);
          _Var14._M_head_impl =
               (pvVar11->
               super_unique_ptr<duckdb::Expression,_std::default_delete<duckdb::Expression>_>)._M_t.
               super___uniq_ptr_impl<duckdb::Expression,_std::default_delete<duckdb::Expression>_>.
               _M_t.
               super__Tuple_impl<0UL,_duckdb::Expression_*,_std::default_delete<duckdb::Expression>_>
               .super__Head_base<0UL,_duckdb::Expression_*,_false>._M_head_impl;
          (pvVar11->super_unique_ptr<duckdb::Expression,_std::default_delete<duckdb::Expression>_>).
          _M_t.super___uniq_ptr_impl<duckdb::Expression,_std::default_delete<duckdb::Expression>_>.
          _M_t.
          super__Tuple_impl<0UL,_duckdb::Expression_*,_std::default_delete<duckdb::Expression>_>.
          super__Head_base<0UL,_duckdb::Expression_*,_false>._M_head_impl = (Expression *)0x0;
          plVar3 = (long *)*in_RCX;
          *in_RCX = (long)_Var14._M_head_impl;
          if (plVar3 != (long *)0x0) {
            (**(code **)(*plVar3 + 8))();
          }
        }
        else if (8 < (ulong)((long)puVar5[0xc].
                                   super_unique_ptr<duckdb::Expression,_std::default_delete<duckdb::Expression>_>
                                   ._M_t.
                                   super___uniq_ptr_impl<duckdb::Expression,_std::default_delete<duckdb::Expression>_>
                                   ._M_t.
                                   super__Tuple_impl<0UL,_duckdb::Expression_*,_std::default_delete<duckdb::Expression>_>
                                   .super__Head_base<0UL,_duckdb::Expression_*,_false>._M_head_impl
                            - (long)puVar5[0xb].
                                    super_unique_ptr<duckdb::Expression,_std::default_delete<duckdb::Expression>_>
                                    ._M_t.
                                    super___uniq_ptr_impl<duckdb::Expression,_std::default_delete<duckdb::Expression>_>
                                    ._M_t.
                                    super__Tuple_impl<0UL,_duckdb::Expression_*,_std::default_delete<duckdb::Expression>_>
                                    .super__Head_base<0UL,_duckdb::Expression_*,_false>._M_head_impl
                            )) {
          sVar15 = 1;
          do {
            pvVar8 = vector<duckdb::unique_ptr<duckdb::BaseStatistics,_std::default_delete<duckdb::BaseStatistics>,_true>,_true>
                     ::operator[]((vector<duckdb::unique_ptr<duckdb::BaseStatistics,_std::default_delete<duckdb::BaseStatistics>,_true>,_true>
                                   *)&local_e8,0);
            pBVar9 = unique_ptr<duckdb::BaseStatistics,_std::default_delete<duckdb::BaseStatistics>,_true>
                     ::operator->(pvVar8);
            pvVar8 = vector<duckdb::unique_ptr<duckdb::BaseStatistics,_std::default_delete<duckdb::BaseStatistics>,_true>,_true>
                     ::operator[]((vector<duckdb::unique_ptr<duckdb::BaseStatistics,_std::default_delete<duckdb::BaseStatistics>,_true>,_true>
                                   *)&local_e8,sVar15);
            other = unique_ptr<duckdb::BaseStatistics,_std::default_delete<duckdb::BaseStatistics>,_true>
                    ::operator*(pvVar8);
            BaseStatistics::Merge(pBVar9,other);
            sVar15 = sVar15 + 1;
          } while (sVar15 < (ulong)((long)local_c8[0xc].
                                          super_unique_ptr<duckdb::Expression,_std::default_delete<duckdb::Expression>_>
                                          ._M_t.
                                          super___uniq_ptr_impl<duckdb::Expression,_std::default_delete<duckdb::Expression>_>
                                          ._M_t.
                                          super__Tuple_impl<0UL,_duckdb::Expression_*,_std::default_delete<duckdb::Expression>_>
                                          .super__Head_base<0UL,_duckdb::Expression_*,_false>.
                                          _M_head_impl -
                                    (long)local_c8[0xb].
                                          super_unique_ptr<duckdb::Expression,_std::default_delete<duckdb::Expression>_>
                                          ._M_t.
                                          super___uniq_ptr_impl<duckdb::Expression,_std::default_delete<duckdb::Expression>_>
                                          ._M_t.
                                          super__Tuple_impl<0UL,_duckdb::Expression_*,_std::default_delete<duckdb::Expression>_>
                                          .super__Head_base<0UL,_duckdb::Expression_*,_false>.
                                          _M_head_impl >> 3));
        }
        _Var12._M_head_impl =
             (BaseStatistics *)
             vector<duckdb::unique_ptr<duckdb::BaseStatistics,_std::default_delete<duckdb::BaseStatistics>,_true>,_true>
             ::operator[]((vector<duckdb::unique_ptr<duckdb::BaseStatistics,_std::default_delete<duckdb::BaseStatistics>,_true>,_true>
                           *)&local_e8,0);
        _Var13._M_head_impl = *(BaseStatistics **)&(_Var12._M_head_impl)->type;
        goto LAB_00d49927;
      }
      pvVar8 = vector<duckdb::unique_ptr<duckdb::BaseStatistics,_std::default_delete<duckdb::BaseStatistics>,_true>,_true>
               ::operator[]((vector<duckdb::unique_ptr<duckdb::BaseStatistics,_std::default_delete<duckdb::BaseStatistics>,_true>,_true>
                             *)&local_e8,0);
      pBVar9 = unique_ptr<duckdb::BaseStatistics,_std::default_delete<duckdb::BaseStatistics>,_true>
               ::operator->(pvVar8);
      bVar7 = BaseStatistics::CanHaveNull(pBVar9);
      if (bVar7) {
        pvVar8 = vector<duckdb::unique_ptr<duckdb::BaseStatistics,_std::default_delete<duckdb::BaseStatistics>,_true>,_true>
                 ::operator[]((vector<duckdb::unique_ptr<duckdb::BaseStatistics,_std::default_delete<duckdb::BaseStatistics>,_true>,_true>
                               *)&local_e8,0);
        pBVar9 = unique_ptr<duckdb::BaseStatistics,_std::default_delete<duckdb::BaseStatistics>,_true>
                 ::operator->(pvVar8);
        bVar7 = BaseStatistics::CanHaveNoNull(pBVar9);
        if (bVar7) goto LAB_00d49728;
        Value::BOOLEAN(&local_b0,false);
        this_01 = (BoundConstantExpression *)operator_new(0x98);
        Value::Value((Value *)local_70,&local_b0);
        BoundConstantExpression::BoundConstantExpression(this_01,(Value *)local_70);
      }
      else {
        Value::BOOLEAN(&local_b0,true);
        this_01 = (BoundConstantExpression *)operator_new(0x98);
        Value::Value((Value *)local_70,&local_b0);
        BoundConstantExpression::BoundConstantExpression(this_01,(Value *)local_70);
      }
    }
    Value::~Value((Value *)local_70);
    plVar3 = (long *)*in_RCX;
    *in_RCX = (long)this_01;
    if (plVar3 != (long *)0x0) {
      (**(code **)(*plVar3 + 8))();
    }
    Value::~Value(&local_b0);
    PropagateExpression(this,(unique_ptr<duckdb::Expression,_std::default_delete<duckdb::Expression>,_true>
                              *)local_c0);
  }
  else {
    bVar7 = true;
    local_b8._M_head_impl = (BaseStatistics *)this;
    do {
      PropagateExpression((StatisticsPropagator *)local_70,
                          (unique_ptr<duckdb::Expression,_std::default_delete<duckdb::Expression>,_true>
                           *)local_c0);
      if (local_70[0] == (Optimizer *)0x0) {
        bVar7 = false;
      }
      ::std::
      vector<duckdb::unique_ptr<duckdb::BaseStatistics,std::default_delete<duckdb::BaseStatistics>,true>,std::allocator<duckdb::unique_ptr<duckdb::BaseStatistics,std::default_delete<duckdb::BaseStatistics>,true>>>
      ::
      emplace_back<duckdb::unique_ptr<duckdb::BaseStatistics,std::default_delete<duckdb::BaseStatistics>,true>>
                ((vector<duckdb::unique_ptr<duckdb::BaseStatistics,std::default_delete<duckdb::BaseStatistics>,true>,std::allocator<duckdb::unique_ptr<duckdb::BaseStatistics,std::default_delete<duckdb::BaseStatistics>,true>>>
                  *)&local_e8,
                 (unique_ptr<duckdb::BaseStatistics,_std::default_delete<duckdb::BaseStatistics>,_true>
                  *)local_70);
      pOVar6 = local_70[0];
      if (local_70[0] != (Optimizer *)0x0) {
        BaseStatistics::~BaseStatistics((BaseStatistics *)local_70[0]);
        operator_delete(pOVar6);
      }
      _Var14._M_head_impl = (Expression *)&((_Var14._M_head_impl)->super_BaseExpression).type;
    } while (_Var14._M_head_impl != _Var2._M_head_impl);
    this = (StatisticsPropagator *)local_b8._M_head_impl;
    _Var12._M_head_impl = local_b8._M_head_impl;
    if (bVar7) goto LAB_00d4959f;
LAB_00d49728:
    _Var13._M_head_impl = (BaseStatistics *)0x0;
    this = (StatisticsPropagator *)_Var12._M_head_impl;
LAB_00d49927:
    *(BaseStatistics **)this = _Var13._M_head_impl;
    *(__uniq_ptr_data<duckdb::BaseStatistics,_std::default_delete<duckdb::BaseStatistics>,_true,_true>
      *)_Var12._M_head_impl =
         (__uniq_ptr_data<duckdb::BaseStatistics,_std::default_delete<duckdb::BaseStatistics>,_true,_true>
          )0x0;
  }
  ::std::
  vector<duckdb::unique_ptr<duckdb::BaseStatistics,_std::default_delete<duckdb::BaseStatistics>,_true>,_std::allocator<duckdb::unique_ptr<duckdb::BaseStatistics,_std::default_delete<duckdb::BaseStatistics>,_true>_>_>
  ::~vector(&local_e8);
  return (unique_ptr<duckdb::BaseStatistics,_std::default_delete<duckdb::BaseStatistics>_>)
         (__uniq_ptr_impl<duckdb::BaseStatistics,_std::default_delete<duckdb::BaseStatistics>_>)this
  ;
}

Assistant:

unique_ptr<BaseStatistics> StatisticsPropagator::PropagateExpression(BoundOperatorExpression &expr,
                                                                     unique_ptr<Expression> &expr_ptr) {
	bool all_have_stats = true;
	vector<unique_ptr<BaseStatistics>> child_stats;
	child_stats.reserve(expr.children.size());
	for (auto &child : expr.children) {
		auto stats = PropagateExpression(child);
		if (!stats) {
			all_have_stats = false;
		}
		child_stats.push_back(std::move(stats));
	}
	if (!all_have_stats) {
		return nullptr;
	}
	switch (expr.GetExpressionType()) {
	case ExpressionType::OPERATOR_COALESCE:
		// COALESCE, merge stats of all children
		for (idx_t i = 0; i < expr.children.size(); i++) {
			D_ASSERT(child_stats[i]);
			if (!child_stats[i]->CanHaveNoNull()) {
				// this child is always NULL, we can remove it from the coalesce
				// UNLESS there is only one node remaining
				if (expr.children.size() > 1) {
					expr.children.erase_at(i);
					child_stats.erase_at(i);
					i--;
				}
			} else if (!child_stats[i]->CanHaveNull()) {
				// coalesce child cannot have NULL entries
				// this is the last coalesce node that influences the result
				// we can erase any children after this node
				if (i + 1 < expr.children.size()) {
					expr.children.erase(expr.children.begin() + NumericCast<int64_t>(i + 1), expr.children.end());
					child_stats.erase(child_stats.begin() + NumericCast<int64_t>(i + 1), child_stats.end());
				}
				break;
			}
		}
		D_ASSERT(!expr.children.empty());
		D_ASSERT(expr.children.size() == child_stats.size());
		if (expr.children.size() == 1) {
			// coalesce of one entry: simply return that entry
			expr_ptr = std::move(expr.children[0]);
		} else {
			// coalesce of multiple entries
			// merge the stats
			for (idx_t i = 1; i < expr.children.size(); i++) {
				child_stats[0]->Merge(*child_stats[i]);
			}
		}
		return std::move(child_stats[0]);
	case ExpressionType::OPERATOR_IS_NULL:
		if (!child_stats[0]->CanHaveNull()) {
			// child has no null values: x IS NULL will always be false
			expr_ptr = make_uniq<BoundConstantExpression>(Value::BOOLEAN(false));
			return PropagateExpression(expr_ptr);
		}
		if (!child_stats[0]->CanHaveNoNull()) {
			// child has no valid values: x IS NULL will always be true
			expr_ptr = make_uniq<BoundConstantExpression>(Value::BOOLEAN(true));
			return PropagateExpression(expr_ptr);
		}
		return nullptr;
	case ExpressionType::OPERATOR_IS_NOT_NULL:
		if (!child_stats[0]->CanHaveNull()) {
			// child has no null values: x IS NOT NULL will always be true
			expr_ptr = make_uniq<BoundConstantExpression>(Value::BOOLEAN(true));
			return PropagateExpression(expr_ptr);
		}
		if (!child_stats[0]->CanHaveNoNull()) {
			// child has no valid values: x IS NOT NULL will always be false
			expr_ptr = make_uniq<BoundConstantExpression>(Value::BOOLEAN(false));
			return PropagateExpression(expr_ptr);
		}
		return nullptr;
	default:
		return nullptr;
	}
}